

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateTargetFileSets
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ostream *os,cmTargetExport *te)

{
  cmMakefile *this_00;
  ostream *poVar1;
  cmFileSet *pcVar2;
  string *args_1;
  WrapQuotes wrapQuotes;
  cmTargetExport *in_R8;
  pointer name;
  string_view str;
  string_view str_00;
  string local_110;
  string *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  cmAlphaNum local_d0;
  string targetName;
  cmAlphaNum local_80;
  string local_50 [32];
  
  cmTarget::GetAllInterfaceFileSets_abi_cxx11_(&interfaceFileSets,gte->Target);
  if (interfaceFileSets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      interfaceFileSets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d0.View_._M_str = (this->Namespace)._M_dataplus._M_p;
    local_d0.View_._M_len = (this->Namespace)._M_string_length;
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_110,gte);
    local_80.View_._M_len = local_110._M_string_length;
    local_80.View_._M_str = local_110._M_dataplus._M_p;
    cmStrCat<>(&targetName,&local_d0,&local_80);
    std::__cxx11::string::~string((string *)&local_110);
    poVar1 = std::operator<<(os,"if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n  target_sources(");
    poVar1 = std::operator<<(poVar1,(string *)&targetName);
    std::operator<<(poVar1,"\n");
    local_f0 = interfaceFileSets.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (name = interfaceFileSets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; wrapQuotes = (WrapQuotes)in_R8,
        name != local_f0; name = name + 1) {
      pcVar2 = cmTarget::GetFileSet(gte->Target,name);
      if (pcVar2 == (cmFileSet *)0x0) {
        this_00 = gte->Makefile;
        local_d0.View_._M_len = 10;
        local_d0.View_._M_str = "File set \"";
        local_80.View_._M_str = (name->_M_dataplus)._M_p;
        local_80.View_._M_len = name->_M_string_length;
        args_1 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
        cmStrCat<char[39],std::__cxx11::string,char[26]>
                  (&local_110,&local_d0,&local_80,
                   (char (*) [39])"\" is listed in interface file sets of ",args_1,
                   (char (*) [26])" but has not been created");
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        goto LAB_003416ba;
      }
      poVar1 = std::operator<<(os,"    INTERFACE");
      poVar1 = std::operator<<(poVar1,"\n      FILE_SET ");
      str._M_str = (char *)0x0;
      str._M_len = (size_t)(name->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)&local_d0,(cmOutputConverter *)name->_M_string_length,str,wrapQuotes);
      poVar1 = std::operator<<(poVar1,(string *)&local_d0);
      poVar1 = std::operator<<(poVar1,"\n      TYPE ");
      str_00._M_str = (char *)0x0;
      str_00._M_len = (size_t)(pcVar2->Type)._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)&local_80,(cmOutputConverter *)(pcVar2->Type)._M_string_length,str_00,
                 wrapQuotes);
      poVar1 = std::operator<<(poVar1,(string *)&local_80);
      poVar1 = std::operator<<(poVar1,"\n      BASE_DIRS ");
      (*this->_vptr_cmExportFileGenerator[0x11])(&local_110,this,gte,pcVar2,te);
      poVar1 = std::operator<<(poVar1,(string *)&local_110);
      poVar1 = std::operator<<(poVar1,"\n      FILES ");
      in_R8 = te;
      (*this->_vptr_cmExportFileGenerator[0x12])(local_50,this,gte);
      poVar1 = std::operator<<(poVar1,local_50);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::operator<<(os,"  )\nendif()\n\n");
LAB_003416ba:
    std::__cxx11::string::~string((string *)&targetName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&interfaceFileSets);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateTargetFileSets(cmGeneratorTarget* gte,
                                                   std::ostream& os,
                                                   cmTargetExport* te)
{
  auto interfaceFileSets = gte->Target->GetAllInterfaceFileSets();
  if (!interfaceFileSets.empty()) {
    std::string targetName = cmStrCat(this->Namespace, gte->GetExportName());
    os << "if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n"
          "  target_sources("
       << targetName << "\n";

    for (auto const& name : interfaceFileSets) {
      auto* fileSet = gte->Target->GetFileSet(name);
      if (!fileSet) {
        gte->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("File set \"", name,
                   "\" is listed in interface file sets of ", gte->GetName(),
                   " but has not been created"));
        return;
      }

      os << "    INTERFACE"
         << "\n      FILE_SET " << cmOutputConverter::EscapeForCMake(name)
         << "\n      TYPE "
         << cmOutputConverter::EscapeForCMake(fileSet->GetType())
         << "\n      BASE_DIRS "
         << this->GetFileSetDirectories(gte, fileSet, te) << "\n      FILES "
         << this->GetFileSetFiles(gte, fileSet, te) << "\n";
    }

    os << "  )\nendif()\n\n";
  }
}